

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screen_xywh.cxx
# Opt level: O3

void Fl::screen_dpi(float *h,float *v,int n)

{
  if (num_screens < 0) {
    screen_init();
  }
  *v = 0.0;
  *h = 0.0;
  if ((-1 < n) && (n < num_screens)) {
    *h = dpi[(uint)n][0];
    *v = dpi[(uint)n][1];
  }
  return;
}

Assistant:

void Fl::screen_dpi(float &h, float &v, int n)
{
  if (num_screens < 0) screen_init();
  h = v = 0.0f;

#ifdef WIN32
  if (n >= 0 && n < num_screens) {
    h = float(dpi[n][0]);
    v = float(dpi[n][1]);
  }
#elif defined(__APPLE__)
  if (n >= 0 && n < num_screens) {
    h = dpi_h[n];
    v = dpi_v[n];
  }
#else
  if (n >= 0 && n < num_screens) {
    h = dpi[n][0];
    v = dpi[n][1];
  }
#endif // WIN32
}